

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseSubstitution(State *state,bool accept_std)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  char *pcVar8;
  long *plVar9;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    bVar7 = ParseTwoCharToken(state,"S_");
    if (bVar7) {
LAB_00276fd6:
      MaybeAppend(state,"?");
LAB_00276fe5:
      bVar7 = true;
      goto LAB_0027707f;
    }
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar7 = ParseOneCharToken(state,'S');
    if (bVar7) {
      bVar7 = ParseSeqId(state);
      if (bVar7) {
        bVar7 = ParseOneCharToken(state,'_');
        if (bVar7) goto LAB_00276fd6;
      }
    }
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseOneCharToken(state,'S');
    if (bVar7) {
      pcVar8 = "St";
      plVar9 = (long *)(kSubstitutionList + 0x18);
      do {
        if ((state->mangled_begin[(state->parse_state).mangled_idx] == pcVar8[1]) &&
           (pcVar8[1] != 't' || accept_std)) {
          MaybeAppend(state,"std");
          pcVar8 = (char *)plVar9[-2];
          if (*pcVar8 != '\0') {
            MaybeAppend(state,"::");
            MaybeAppend(state,pcVar8);
          }
          pPVar1->mangled_idx = pPVar1->mangled_idx + 1;
          goto LAB_00276fe5;
        }
        pcVar8 = (char *)*plVar9;
        plVar9 = plVar9 + 3;
      } while (pcVar8 != (char *)0x0);
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  }
  bVar7 = false;
LAB_0027707f:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar7;
}

Assistant:

static bool ParseSubstitution(State *state, bool accept_std) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  state->parse_state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != nullptr; ++p) {
      if (RemainingInput(state)[0] == p->abbrev[1] &&
          (accept_std || p->abbrev[1] != 't')) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->parse_state.mangled_idx;
        UpdateHighWaterMark(state);
        return true;
      }
    }
  }
  state->parse_state = copy;
  return false;
}